

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O1

void __thiscall libtorrent::lcrypto::hasher::reset(hasher *this)

{
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  
  ctx = (EVP_MD_CTX *)this->m_context;
  type = EVP_sha1();
  EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
  return;
}

Assistant:

void hasher::reset()
	{
#ifdef TORRENT_USE_LIBGCRYPT
		gcry_md_reset(m_context);
#elif TORRENT_USE_COMMONCRYPTO
		CC_SHA1_Init(&m_context);
#elif TORRENT_USE_CNG
		m_context.reset();
#elif TORRENT_USE_CRYPTOAPI
		m_context.reset();
#elif defined TORRENT_USE_LIBCRYPTO
		EVP_DigestInit_ex(m_context, EVP_sha1(), nullptr);
#else
		aux::SHA1_init(&m_context);
#endif
	}